

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlBufferShrink(xmlBufferPtr buf,uint len)

{
  ulong uVar1;
  size_t start_buf;
  uint len_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = 0xffffffff;
  }
  else if (len == 0) {
    buf_local._4_4_ = 0;
  }
  else if (buf->use < len) {
    buf_local._4_4_ = 0xffffffff;
  }
  else {
    buf->use = buf->use - len;
    buf_local._4_4_ = len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
       ((buf->alloc == XML_BUFFER_ALLOC_IO && (buf->contentIO != (xmlChar *)0x0)))) {
      buf->content = buf->content + len;
      buf->size = buf->size - len;
      if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
         ((buf->contentIO != (xmlChar *)0x0 &&
          (uVar1 = (long)buf->content - (long)buf->contentIO, buf->size <= uVar1)))) {
        memmove(buf->contentIO,buf->content,(ulong)buf->use);
        buf->content = buf->contentIO;
        buf->content[buf->use] = '\0';
        buf->size = buf->size + (int)uVar1;
      }
    }
    else {
      memmove(buf->content,buf->content + len,(ulong)buf->use);
      buf->content[buf->use] = '\0';
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferShrink(xmlBufferPtr buf, unsigned int len) {
    if (buf == NULL) return(-1);
    if (len == 0) return(0);
    if (len > buf->use) return(-1);

    buf->use -= len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL))) {
	/*
	 * we just move the content pointer, but also make sure
	 * the perceived buffer size has shrunk accordingly
	 */
        buf->content += len;
	buf->size -= len;

        /*
	 * sometimes though it maybe be better to really shrink
	 * on IO buffers
	 */
	if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
	    size_t start_buf = buf->content - buf->contentIO;
	    if (start_buf >= buf->size) {
		memmove(buf->contentIO, &buf->content[0], buf->use);
		buf->content = buf->contentIO;
		buf->content[buf->use] = 0;
		buf->size += start_buf;
	    }
	}
    } else {
	memmove(buf->content, &buf->content[len], buf->use);
	buf->content[buf->use] = 0;
    }
    return(len);
}